

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O2

unique_ptr<Imonitor,_std::default_delete<Imonitor>_> __thiscall
registry::Registry<Imonitor>::create<>(Registry<Imonitor> *this,string *class_name)

{
  map_t *pmVar1;
  size_type sVar2;
  mapped_type *this_00;
  Imonitor *pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pmVar1 = ctors_abi_cxx11_();
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
          ::count(pmVar1,class_name);
  if (sVar2 == 1) {
    pmVar1 = ctors_abi_cxx11_();
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
              ::operator[](pmVar1,class_name);
    pIVar3 = std::function<Imonitor_*()>::operator()(this_00);
  }
  else {
    std::operator+(&local_38,"Registry: class ",class_name);
    std::operator+(&bStack_58,&local_38," is not registered.");
    spdlog::error<std::__cxx11::string>(&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    pIVar3 = (Imonitor *)0x0;
  }
  *(Imonitor **)this = pIVar3;
  return (__uniq_ptr_data<Imonitor,_std::default_delete<Imonitor>,_true,_true>)
         (__uniq_ptr_data<Imonitor,_std::default_delete<Imonitor>,_true,_true>)this;
}

Assistant:

static std::unique_ptr<T> create(const std::string& class_name,
                                   Args&&... pack) {
    if (ctors().count(class_name) == 1) {
      return std::unique_ptr<T>(
          ctors()[class_name](std::forward<Args>(pack)...));
    }
    spdlog::error("Registry: class " + class_name + " is not registered.");
    return std::unique_ptr<T>(nullptr);
  }